

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WaveletTree.h
# Opt level: O2

uchar __thiscall bwtil::WaveletTree::charAt(WaveletTree *this,ulint i)

{
  succinct_bitvector *this_00;
  pointer psVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar5 = 0;
  uVar6 = 0;
  for (uVar4 = 0; uVar4 < this->log_sigma; uVar4 = uVar4 + 1) {
    psVar1 = (this->nodes).
             super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar3 = (byte)i;
    this_00 = psVar1 + uVar6;
    uVar2 = *(ulong *)(*(long *)&psVar1[uVar6].bitvector.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data + (i >> 6) * 8);
    if ((uVar2 >> ((ulong)(byte)~bVar3 & 0x3f) & 1) == 0) {
      i = succinct_bitvector::rank0(this_00,i);
      uVar6 = uVar6 * 2 | 1;
    }
    else {
      i = succinct_bitvector::rank1(this_00,i);
      uVar6 = uVar6 * 2 + 2;
    }
    uVar5 = ((uint)(uVar2 >> ((ulong)(byte)~bVar3 & 0x3f)) & 1) + (uVar5 & 0xff) * 2;
  }
  return (uchar)uVar5;
}

Assistant:

inline uchar charAt(ulint i){

		uchar c=0;
		ulint node = root();
		uint level = 0;
		uint bit=0;

		while(level<height()){

			bit = nodes[node].at(i);
			c = c*2 + bit;

			if(bit==0){

				i = nodes[node].rank0(i);

				assert(i<nodes[node].size());

				node = child0(node);

			}else{

				i = nodes[node].rank1(i);

				assert(i<nodes[node].size());

				node = child1(node);

			}

			level++;

		}

		return c;

	}